

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O0

SessionSpecial * ssh_get_specials(Backend *be)

{
  Interactor *local_38;
  ssh_add_special_ctx ctx [1];
  Ssh *ssh;
  Backend *be_local;
  
  local_38 = (Interactor *)0x0;
  ctx[0].nspecials = 0;
  ctx[0].specials = (SessionSpecial *)0x0;
  if (be[0x19].vt != (BackendVtable *)0x0) {
    ssh_ppl_get_specials((PacketProtocolLayer *)be[0x19].vt,ssh_add_special,&local_38);
  }
  if (local_38 != (Interactor *)0x0) {
    ssh_add_special(&local_38,(char *)0x0,SS_EXITMENU,0);
  }
  safefree(be[3].interactor);
  be[3].interactor = local_38;
  return (SessionSpecial *)be[3].interactor;
}

Assistant:

static const SessionSpecial *ssh_get_specials(Backend *be)
{
    Ssh *ssh = container_of(be, Ssh, backend);

    /*
     * Ask all our active protocol layers what specials they've got,
     * and amalgamate the list into one combined one.
     */

    struct ssh_add_special_ctx ctx[1];

    ctx->specials = NULL;
    ctx->nspecials = ctx->specials_size = 0;

    if (ssh->base_layer)
        ssh_ppl_get_specials(ssh->base_layer, ssh_add_special, ctx);

    if (ctx->specials) {
        /* If the list is non-empty, terminate it with a SS_EXITMENU. */
        ssh_add_special(ctx, NULL, SS_EXITMENU, 0);
    }

    sfree(ssh->specials);
    ssh->specials = ctx->specials;
    return ssh->specials;
}